

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

void __thiscall Process::Process(Process *this)

{
  Process *this_local;
  
  Signal<std::function<void_(Process_*)>_>::Signal(&this->mReadyReadStdOut);
  Signal<std::function<void_(Process_*)>_>::Signal(&this->mReadyReadStdErr);
  Signal<std::function<void_(Process_*)>_>::Signal(&this->mFinished);
  this->mMode = Sync;
  std::deque<String,_std::allocator<String>_>::deque(&this->mStdInBuffer);
  String::String(&this->mStdOutBuffer,(char *)0x0,0xffffffffffffffff);
  String::String(&this->mStdErrBuffer,(char *)0x0,0xffffffffffffffff);
  std::mutex::mutex(&this->mMutex);
  this->mReturn = -2;
  Path::Path(&this->mCwd);
  Path::Path(&this->mChRoot);
  String::String(&this->mErrorString,(char *)0x0,0xffffffffffffffff);
  this->mStdInIndex = 0;
  this->mStdOutIndex = 0;
  this->mStdErrIndex = 0;
  this->mWantStdInClosed = false;
  this->mPid = -1;
  std::call_once<void(&)()>(&sProcessHandler,ProcessThread::installProcessHandler);
  this->mStdIn[1] = -1;
  this->mStdIn[0] = -1;
  this->mStdOut[1] = -1;
  this->mStdOut[0] = -1;
  this->mStdErr[1] = -1;
  this->mStdErr[0] = -1;
  this->mSync[1] = -1;
  this->mSync[0] = -1;
  return;
}

Assistant:

Process::Process()
    : mMode(Sync), mReturn(ReturnUnset),
      mStdInIndex(0), mStdOutIndex(0), mStdErrIndex(0),
      mWantStdInClosed(false), mPid(-1)
{
    std::call_once(sProcessHandler, ProcessThread::installProcessHandler);

    mStdIn[0] = mStdIn[1] = -1;
    mStdOut[0] = mStdOut[1] = -1;
    mStdErr[0] = mStdErr[1] = -1;
    mSync[0] = mSync[1] = -1;
}